

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O0

MPP_RET mpi_rc_cmp_frame(MppFrame frame_in,MppFrame frame_out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  RK_U32 dec_height;
  RK_U32 dec_width;
  RK_U32 enc_height;
  RK_U32 enc_width;
  void *dec_buf;
  void *enc_buf;
  MppFrame frame_out_local;
  MppFrame frame_in_local;
  
  uVar5 = mpp_frame_get_buffer(frame_in);
  lVar6 = mpp_buffer_get_ptr_with_caller(uVar5,"mpi_rc_cmp_frame");
  uVar5 = mpp_frame_get_buffer(frame_out);
  lVar7 = mpp_buffer_get_ptr_with_caller(uVar5,"mpi_rc_cmp_frame");
  iVar1 = mpp_frame_get_width(frame_in);
  iVar2 = mpp_frame_get_height(frame_in);
  iVar3 = mpp_frame_get_width(frame_out);
  iVar4 = mpp_frame_get_height(frame_out);
  if (lVar6 == 0) {
    _mpp_log_l(2,"mpi_rc_test","enc buf is NULL","mpi_rc_cmp_frame");
    frame_in_local._4_4_ = MPP_NOK;
  }
  else if (lVar7 == 0) {
    _mpp_log_l(2,"mpi_rc_test","dec buf is NULL","mpi_rc_cmp_frame");
    frame_in_local._4_4_ = MPP_NOK;
  }
  else if (iVar1 == iVar3) {
    if (iVar2 == iVar4) {
      frame_in_local._4_4_ = MPP_OK;
    }
    else {
      _mpp_log_l(2,"mpi_rc_test","enc_height %d != dec_height %d","mpi_rc_cmp_frame",iVar2,iVar4);
      frame_in_local._4_4_ = MPP_NOK;
    }
  }
  else {
    _mpp_log_l(2,"mpi_rc_test","enc_width %d != dec_width %d","mpi_rc_cmp_frame",iVar1,iVar3);
    frame_in_local._4_4_ = MPP_NOK;
  }
  return frame_in_local._4_4_;
}

Assistant:

static MPP_RET mpi_rc_cmp_frame(MppFrame frame_in, MppFrame frame_out)
{
    void *enc_buf = mpp_buffer_get_ptr(mpp_frame_get_buffer(frame_in));
    void *dec_buf = mpp_buffer_get_ptr(mpp_frame_get_buffer(frame_out));
    RK_U32 enc_width  = mpp_frame_get_width(frame_in);
    RK_U32 enc_height = mpp_frame_get_height(frame_in);
    RK_U32 dec_width  = mpp_frame_get_width(frame_out);
    RK_U32 dec_height = mpp_frame_get_height(frame_out);

    if (!enc_buf) {
        mpp_err_f("enc buf is NULL");
        return MPP_NOK;
    }

    if (!dec_buf) {
        mpp_err_f("dec buf is NULL");
        return MPP_NOK;
    }

    if (enc_width != dec_width) {
        mpp_err_f("enc_width %d != dec_width %d", enc_width, dec_width);
        return MPP_NOK;
    }

    if (enc_height != dec_height) {
        mpp_err_f("enc_height %d != dec_height %d", enc_height, dec_height);
        return MPP_NOK;
    }

    return MPP_OK;
}